

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::ProjectionLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,ProjectionLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [56];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  Vector3f wl;
  SampledSpectrum SVar24;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_28 [16];
  undefined1 auVar13 [56];
  undefined1 auVar19 [64];
  
  auVar15 = ZEXT816(0) << 0x40;
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)),
                           auVar15,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]))
  ;
  auVar10 = vfmadd231ss_fma(auVar10,auVar15,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar15,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  auVar15._0_4_ = auVar7._0_4_ * 0.0;
  auVar15._4_4_ = auVar7._4_4_ * 0.0;
  auVar15._8_4_ = auVar7._8_4_ * 0.0;
  auVar15._12_4_ = auVar7._12_4_ * 0.0;
  fVar22 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar14 = auVar10._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar3 = fVar22 == 1.0;
  uVar5 = 0xff;
  if (!bVar3) {
    uVar5 = 0;
  }
  uVar6 = (ulong)uVar5;
  if (NAN(fVar22)) {
    uVar6 = 0;
  }
  local_38 = (float)((uint)bVar3 * (int)fVar14 + (uint)!bVar3 * (int)(fVar14 / fVar22));
  auVar7 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  auVar10 = vfmadd213ps_fma(auVar7,ZEXT816(0) << 0x40,auVar15);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar10 = vfmadd213ps_fma(auVar7,ZEXT816(0) << 0x40,auVar10);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][3]),0x10);
  auVar8._0_4_ = auVar7._0_4_ + auVar10._0_4_;
  auVar8._4_4_ = auVar7._4_4_ + auVar10._4_4_;
  auVar8._8_4_ = auVar7._8_4_ + auVar10._8_4_;
  auVar8._12_4_ = auVar7._12_4_ + auVar10._12_4_;
  auVar16._4_4_ = fVar22;
  auVar16._0_4_ = fVar22;
  auVar16._8_4_ = fVar22;
  auVar16._12_4_ = fVar22;
  auVar7 = vdivps_avx(auVar8,auVar16);
  auVar10 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                          ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  bVar3 = (bool)((byte)uVar6 & 1);
  local_48 = (float)((uint)bVar3 * (int)auVar8._0_4_ | (uint)!bVar3 * auVar7._0_4_);
  bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
  fStack_44 = (float)((uint)bVar3 * (int)auVar8._4_4_ | (uint)!bVar3 * auVar7._4_4_);
  bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
  fStack_40 = (float)((uint)bVar3 * (int)auVar8._8_4_ | (uint)!bVar3 * auVar7._8_4_);
  bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
  fStack_3c = (float)((uint)bVar3 * (int)auVar8._12_4_ | (uint)!bVar3 * auVar7._12_4_);
  auVar9._0_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high + auVar10._0_4_;
  auVar9._4_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low + auVar10._4_4_;
  auVar9._8_4_ = auVar10._8_4_ + 0.0;
  auVar9._12_4_ = auVar10._12_4_ + 0.0;
  auVar7._8_4_ = 0xbf000000;
  auVar7._0_8_ = 0xbf000000bf000000;
  auVar7._12_4_ = 0xbf000000;
  auVar7 = vmulps_avx512vl(auVar9,auVar7);
  auVar10._0_4_ = local_48 + auVar7._0_4_;
  auVar10._4_4_ = fStack_44 + auVar7._4_4_;
  auVar10._8_4_ = fStack_40 + auVar7._8_4_;
  auVar10._12_4_ = fStack_3c + auVar7._12_4_;
  fVar22 = local_38 +
           (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
           ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
           -0.5;
  auVar17._0_4_ = auVar10._0_4_ * auVar10._0_4_;
  auVar17._4_4_ = auVar10._4_4_ * auVar10._4_4_;
  auVar17._8_4_ = auVar10._8_4_ * auVar10._8_4_;
  auVar17._12_4_ = auVar10._12_4_ * auVar10._12_4_;
  auVar7 = vhaddps_avx(auVar17,auVar17);
  fVar14 = auVar7._0_4_ + fVar22 * fVar22;
  local_28 = ZEXT416((uint)fVar14);
  auVar7 = vsqrtss_avx(local_28,ZEXT416((uint)fVar14));
  fVar14 = auVar7._0_4_;
  auVar23._4_4_ = fVar14;
  auVar23._0_4_ = fVar14;
  auVar23._8_4_ = fVar14;
  auVar23._12_4_ = fVar14;
  auVar21._0_4_ = fVar22 / fVar14;
  auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_58 = vdivps_avx(auVar10,auVar23);
  auVar7 = vmovshdup_avx(local_58);
  fVar22 = auVar7._0_4_;
  auVar7 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                    [0][1])),local_58,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),local_58,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar7 = vfnmadd231ss_fma(auVar7,auVar21,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar10 = vfnmadd231ss_fma(auVar10,auVar21,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar7 = vinsertps_avx(auVar7,auVar10,0x10);
  auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar22 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),local_58,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar10 = vfnmadd231ss_fma(auVar10,auVar21,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar7._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
  auVar20 = ZEXT856(auVar10._8_8_);
  auVar13 = ZEXT856(auVar7._8_8_);
  SVar24 = I(this,wl,&lambda);
  auVar19._0_8_ = SVar24.values.values._8_8_;
  auVar19._8_56_ = auVar20;
  auVar12._0_8_ = SVar24.values.values._0_8_;
  auVar12._8_56_ = auVar13;
  auVar7 = vmovlhps_avx(auVar12._0_16_,auVar19._0_16_);
  auVar18._4_4_ = local_28._0_4_;
  auVar18._0_4_ = local_28._0_4_;
  auVar18._8_4_ = local_28._0_4_;
  auVar18._12_4_ = local_28._0_4_;
  auVar7 = vdivps_avx(auVar7,auVar18);
  if ((auVar7._0_4_ == 0.0) && (!NAN(auVar7._0_4_))) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 2) goto LAB_002f3d1d;
      lVar1 = uVar6 * 4;
      uVar6 = uVar6 + 1;
    } while ((*(float *)(local_58 + lVar1 + -8) == 0.0) && (!NAN(*(float *)(local_58 + lVar1 + -8)))
            );
    if (2 < uVar6) {
LAB_002f3d1d:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      return __return_storage_ptr__;
    }
  }
  local_68 = auVar7._0_8_;
  uStack_60 = auVar7._8_8_;
  auVar11._4_4_ = local_38;
  auVar11._0_4_ = local_38;
  auVar11._8_4_ = local_38;
  auVar11._12_4_ = local_38;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20;
  (__return_storage_ptr__->optionalValue).__align = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_60;
  __return_storage_ptr__->set = true;
  uVar2 = vmovlps_avx(local_58);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  auVar4._4_4_ = fStack_44;
  auVar4._0_4_ = local_48;
  auVar4._8_4_ = fStack_40;
  auVar4._12_4_ = fStack_3c;
  auVar7 = vpermilps_avx(auVar4,0x50);
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar21._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar7;
  uVar2 = vmovlps_avx(auVar11);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> ProjectionLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                        SampledWavelengths lambda,
                                                        LightSamplingMode mode) const {
    // Return sample for incident radiance from _ProjectionLight_
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    Vector3f wl = renderFromLight.ApplyInverse(-wi);
    SampledSpectrum Li = I(wl, lambda) / DistanceSquared(p, ctx.p());
    if (!Li)
        return {};
    return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
}